

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::AddLocalMinPoly(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *pt)

{
  bool bVar1;
  TEdge *pTVar2;
  long64 lVar3;
  long64 lVar4;
  TEdge *edge;
  
  if ((ABS(e2->dx + 1e+40) < 1e-20) || (e2->dx < e1->dx)) {
    AddOutPt(this,e1,pt);
    e2->outIdx = e1->outIdx;
    e1->side = esLeft;
    e2->side = esRight;
    edge = e1->prevInAEL;
    pTVar2 = e2;
    if (edge != e2) goto LAB_0052941f;
  }
  else {
    AddOutPt(this,e2,pt);
    e1->outIdx = e2->outIdx;
    e1->side = esRight;
    e2->side = esLeft;
    edge = e2->prevInAEL;
    bVar1 = edge != e1;
    pTVar2 = e1;
    e1 = e2;
    if (bVar1) goto LAB_0052941f;
  }
  edge = pTVar2->prevInAEL;
LAB_0052941f:
  if ((edge != (TEdge *)0x0) && (-1 < edge->outIdx)) {
    lVar4 = pt->Y;
    lVar3 = TopX(edge,lVar4);
    lVar4 = TopX(e1,lVar4);
    if ((lVar3 == lVar4) &&
       (bVar1 = SlopesEqual(e1,edge,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                          [(long)&(this->m_PolyOuts).
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                          ]), bVar1)) {
      AddJoin(this,e1,edge,-1,-1);
      return;
    }
  }
  return;
}

Assistant:

void Clipper::AddLocalMinPoly(TEdge *e1, TEdge *e2, const IntPoint &pt)
{
  TEdge *e, *prevE;
  if( NEAR_EQUAL(e2->dx, HORIZONTAL) || ( e1->dx > e2->dx ) )
  {
    AddOutPt( e1, pt );
    e2->outIdx = e1->outIdx;
    e1->side = esLeft;
    e2->side = esRight;
    e = e1;
    if (e->prevInAEL == e2)
      prevE = e2->prevInAEL; 
    else
      prevE = e->prevInAEL;
  } else
  {
    AddOutPt( e2, pt );
    e1->outIdx = e2->outIdx;
    e1->side = esRight;
    e2->side = esLeft;
    e = e2;
    if (e->prevInAEL == e1)
        prevE = e1->prevInAEL;
    else
        prevE = e->prevInAEL;
  }
  if (prevE && prevE->outIdx >= 0 &&
      (TopX(*prevE, pt.Y) == TopX(*e, pt.Y)) &&
        SlopesEqual(*e, *prevE, m_UseFullRange))
          AddJoin(e, prevE, -1, -1);
}